

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O2

void * v2i_subject_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  size_t i;
  ulong i_00;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0020beb5:
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    for (i_00 = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval), i_00 < sVar2; i_00 = i_00 + 1) {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,i_00);
      iVar1 = x509v3_conf_name_matches(cnf->name,"email");
      if (((iVar1 == 0) || (cnf->value == (char *)0x0)) ||
         (iVar1 = strcmp(cnf->value,"copy"), iVar1 != 0)) {
        iVar1 = x509v3_conf_name_matches(cnf->name,"email");
        if (((iVar1 != 0) && (cnf->value != (char *)0x0)) &&
           (iVar1 = strcmp(cnf->value,"move"), iVar1 == 0)) {
          iVar1 = 1;
          goto LAB_0020be8d;
        }
        a = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,cnf);
        if ((a == (GENERAL_NAME *)0x0) || (sVar2 = OPENSSL_sk_push(sk,a), sVar2 == 0)) {
          GENERAL_NAME_free(a);
          goto LAB_0020bea6;
        }
      }
      else {
        iVar1 = 0;
LAB_0020be8d:
        iVar1 = copy_email(ctx,(GENERAL_NAMES *)sk,iVar1);
        if (iVar1 == 0) {
LAB_0020bea6:
          sk_GENERAL_NAME_pop_free((stack_st_GENERAL_NAME *)sk,GENERAL_NAME_free);
          goto LAB_0020beb5;
        }
      }
    }
  }
  return sk;
}

Assistant:

static void *v2i_subject_alt(const X509V3_EXT_METHOD *method,
                             const X509V3_CTX *ctx,
                             const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "email") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_email(ctx, gens, 0)) {
        goto err;
      }
    } else if (x509v3_conf_name_matches(cnf->name, "email") && cnf->value &&
               !strcmp(cnf->value, "move")) {
      if (!copy_email(ctx, gens, 1)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}